

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall
btConvexHullInternal::computeInternal
          (btConvexHullInternal *this,int start,int end,IntermediateHull *result)

{
  Vertex *pVVar1;
  bool bVar2;
  int iVar3;
  Vertex **ppVVar4;
  long *in_RCX;
  int in_EDX;
  char *__to;
  char *__to_00;
  int in_ESI;
  long in_RDI;
  IntermediateHull hull1;
  int split1;
  Point32 p;
  int split0;
  Vertex *v_1;
  Edge *e;
  Vertex *t;
  int32_t dy;
  int32_t dx;
  Vertex *w;
  Vertex *v;
  int n;
  IntermediateHull *in_stack_000001e0;
  IntermediateHull *in_stack_000001e8;
  btConvexHullInternal *in_stack_000001f0;
  bool local_9d;
  undefined4 in_stack_ffffffffffffff70;
  Vertex *in_stack_ffffffffffffff78;
  btConvexHullInternal *in_stack_ffffffffffffff80;
  int local_68;
  Point32 local_64;
  int local_54;
  Edge *local_48;
  Vertex *local_40;
  int local_38;
  int local_34;
  Vertex *local_30;
  Vertex *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar3 = in_EDX - in_ESI;
  if (iVar3 == 0) {
    *in_RCX = 0;
    in_RCX[1] = 0;
    in_RCX[2] = 0;
    in_RCX[3] = 0;
    return;
  }
  if (iVar3 != 1) {
    if (iVar3 != 2) {
      local_54 = in_ESI + iVar3 / 2;
      ppVVar4 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                          ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)(in_RDI + 0x80),
                           local_54 + -1);
      pVVar1 = *ppVVar4;
      local_64.x = (pVVar1->point).x;
      local_64.y = (pVVar1->point).y;
      local_64.z = (pVVar1->point).z;
      local_64.index = (pVVar1->point).index;
      local_68 = local_54;
      while( true ) {
        local_9d = false;
        if (local_68 < in_EDX) {
          ppVVar4 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                              ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                               (in_RDI + 0x80),local_68);
          local_9d = Point32::operator==(&(*ppVVar4)->point,&local_64);
        }
        if (local_9d == false) break;
        local_68 = local_68 + 1;
      }
      computeInternal((btConvexHullInternal *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                      (int)in_RCX,(IntermediateHull *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
      IntermediateHull::IntermediateHull((IntermediateHull *)&stack0xffffffffffffff78);
      computeInternal((btConvexHullInternal *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                      (int)in_RCX,(IntermediateHull *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
      merge(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
      return;
    }
    ppVVar4 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                        ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)(in_RDI + 0x80),
                         in_ESI);
    local_28 = *ppVVar4;
    local_30 = local_28 + 1;
    bVar2 = Point32::operator!=(&local_28->point,&local_28[1].point);
    pVVar1 = local_30;
    if (bVar2) {
      local_34 = (local_28->point).x - (local_30->point).x;
      local_38 = (local_28->point).y - (local_30->point).y;
      if ((local_34 == 0) && (local_38 == 0)) {
        if ((local_30->point).z < (local_28->point).z) {
          local_40 = local_30;
          local_30 = local_28;
          local_28 = pVVar1;
        }
        local_28->next = local_28;
        local_28->prev = local_28;
        *in_RCX = (long)local_28;
        in_RCX[1] = (long)local_28;
        in_RCX[2] = (long)local_28;
        in_RCX[3] = (long)local_28;
      }
      else {
        local_28->next = local_30;
        local_28->prev = local_30;
        local_30->next = local_28;
        local_30->prev = local_28;
        if ((local_34 < 0) || ((local_34 == 0 && (local_38 < 0)))) {
          *in_RCX = (long)local_28;
          in_RCX[1] = (long)local_30;
        }
        else {
          *in_RCX = (long)local_30;
          in_RCX[1] = (long)local_28;
        }
        if ((local_38 < 0) || ((local_38 == 0 && (local_34 < 0)))) {
          in_RCX[2] = (long)local_28;
          in_RCX[3] = (long)local_30;
        }
        else {
          in_RCX[2] = (long)local_30;
          in_RCX[3] = (long)local_28;
        }
      }
      local_48 = newEdgePair(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                             (Vertex *)CONCAT44(iVar3,in_stack_ffffffffffffff70));
      Edge::link(local_48,(char *)local_48,__to);
      local_28->edges = local_48;
      local_48 = local_48->reverse;
      Edge::link(local_48,(char *)local_48,__to_00);
      local_30->edges = local_48;
      return;
    }
  }
  ppVVar4 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                      ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)(in_RDI + 0x80),
                       in_ESI);
  pVVar1 = *ppVVar4;
  pVVar1->edges = (Edge *)0x0;
  pVVar1->next = pVVar1;
  pVVar1->prev = pVVar1;
  *in_RCX = (long)pVVar1;
  in_RCX[1] = (long)pVVar1;
  in_RCX[2] = (long)pVVar1;
  in_RCX[3] = (long)pVVar1;
  return;
}

Assistant:

void btConvexHullInternal::computeInternal(int start, int end, IntermediateHull& result)
{
	int n = end - start;
	switch (n)
	{
		case 0:
			result.minXy = NULL;
			result.maxXy = NULL;
			result.minYx = NULL;
			result.maxYx = NULL;
			return;
		case 2:
		{
			Vertex* v = originalVertices[start];
			Vertex* w = v + 1;
			if (v->point != w->point)
			{
				int32_t dx = v->point.x - w->point.x;
				int32_t dy = v->point.y - w->point.y;

				if ((dx == 0) && (dy == 0))
				{
					if (v->point.z > w->point.z)
					{
						Vertex* t = w;
						w = v;
						v = t;
					}
					btAssert(v->point.z < w->point.z);
					v->next = v;
					v->prev = v;
					result.minXy = v;
					result.maxXy = v;
					result.minYx = v;
					result.maxYx = v;
				}
				else
				{
					v->next = w;
					v->prev = w;
					w->next = v;
					w->prev = v;

					if ((dx < 0) || ((dx == 0) && (dy < 0)))
					{
						result.minXy = v;
						result.maxXy = w;
					}
					else
					{
						result.minXy = w;
						result.maxXy = v;
					}

					if ((dy < 0) || ((dy == 0) && (dx < 0)))
					{
						result.minYx = v;
						result.maxYx = w;
					}
					else
					{
						result.minYx = w;
						result.maxYx = v;
					}
				}

				Edge* e = newEdgePair(v, w);
				e->link(e);
				v->edges = e;

				e = e->reverse;
				e->link(e);
				w->edges = e;

				return;
			}
		}
		// lint -fallthrough
		case 1:
		{
			Vertex* v = originalVertices[start];
			v->edges = NULL;
			v->next = v;
			v->prev = v;

			result.minXy = v;
			result.maxXy = v;
			result.minYx = v;
			result.maxYx = v;

			return;
		}
	}

	int split0 = start + n / 2;
	Point32 p = originalVertices[split0-1]->point;
	int split1 = split0;
	while ((split1 < end) && (originalVertices[split1]->point == p))
	{
		split1++;
	}
	computeInternal(start, split0, result);
	IntermediateHull hull1;
	computeInternal(split1, end, hull1);
#ifdef DEBUG_CONVEX_HULL
	printf("\n\nMerge\n");
	result.print();
	hull1.print();
#endif
	merge(result, hull1);
#ifdef DEBUG_CONVEX_HULL
	printf("\n  Result\n");
	result.print();
#endif
}